

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

CStatementList * __thiscall IRT::CStatementList::CopyNotConst(CStatementList *this)

{
  CStatementList *pCVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference this_00;
  pointer pCVar4;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_38;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_30;
  int local_28;
  int i;
  CStatementList *local_18;
  CStatementList *list;
  CStatementList *this_local;
  
  list = this;
  pCVar1 = (CStatementList *)operator_new(0x20);
  CStatementList(pCVar1);
  local_28 = 0;
  local_18 = pCVar1;
  while( true ) {
    uVar2 = (ulong)local_28;
    sVar3 = std::
            vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
            ::size(&this->statements);
    pCVar1 = local_18;
    if (sVar3 <= uVar2) break;
    this_00 = std::
              vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
              ::operator[](&this->statements,(long)local_28);
    pCVar4 = std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
             operator->(this_00);
    (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])();
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_30,&local_38);
    Add(pCVar1,&local_30);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_30);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_38);
    local_28 = local_28 + 1;
  }
  return local_18;
}

Assistant:

CStatementList *CStatementList::CopyNotConst() const {
    CStatementList* list = new CStatementList();
    for (int i = 0; i < statements.size(); ++i) {
        list->Add(std::move(statements[i]->Copy()));
    }

    return list;
}